

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails::
RunImpl(TestCheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_9e0 [2];
  TestDetails local_9a0 [2];
  TestDetails local_960 [2];
  TestDetails local_920 [2];
  TestDetails local_8e0;
  float local_8c0;
  ThrowingObject2D local_8b9;
  float local_8b8 [2];
  float data [2] [2];
  undefined1 local_8a0 [8];
  ScopedCurrentTest scopedResults;
  TestDetails testDetails;
  undefined1 local_860 [8];
  TestResults testResults;
  RecordingReporter reporter;
  int line;
  TestCheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails *this_local;
  
  reporter._2092_4_ = 0;
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_860,(TestReporter *)&testResults.m_failureCount);
  UnitTest::TestDetails::TestDetails
            ((TestDetails *)&scopedResults.m_oldTestDetails,"array2DCloseTest","array2DCloseSuite",
             "filename",-1);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_8a0,(TestResults *)local_860,
             (TestDetails *)&scopedResults.m_oldTestDetails);
  local_8b8[0] = 0.0;
  local_8b8[1] = 1.0;
  data[0][0] = 2.0;
  data[0][1] = 3.0;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8c0 = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8e0,*ppTVar3,0x2c4);
  UnitTest::CheckArray2DClose<float[2][2],(anonymous_namespace)::ThrowingObject2D,float>
            (pTVar1,(float (*) [2] [2])local_8b8,&local_8b9,2,2,&local_8c0,&local_8e0);
  reporter._2092_4_ = 0x2c4;
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_8a0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_920,*ppTVar3,0x2c7);
  UnitTest::CheckEqual(pTVar1,"array2DCloseTest",reporter.lastFailedSuite + 0xf8,local_920);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_960,*ppTVar3,0x2c8);
  UnitTest::CheckEqual(pTVar1,"array2DCloseSuite",reporter.lastFailedFile + 0xfc,local_960);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_9a0,*ppTVar3,0x2c9);
  UnitTest::CheckEqual(pTVar1,"filename",reporter.lastStartedTest + 0xfc,local_9a0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_9e0,*ppTVar3,0x2ca);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&reporter.field_0x82c,(int *)(reporter.lastFailedFile + 0xf8),local_9e0);
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("array2DCloseTest", "array2DCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		const float data[2][2] = { {0, 1}, {2, 3} };
        CHECK_ARRAY2D_CLOSE (data, ThrowingObject2D(), 2, 2, 0.01f);   line = __LINE__;
    }

    CHECK_EQUAL("array2DCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("array2DCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}